

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

RegexMatcher *
Catch::Matchers::Matches(RegexMatcher *__return_storage_ptr__,string *regex,Choice caseSensitivity)

{
  string local_40;
  Choice local_1c;
  string *psStack_18;
  Choice caseSensitivity_local;
  string *regex_local;
  
  local_1c = caseSensitivity;
  psStack_18 = regex;
  regex_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40,regex);
  StdString::RegexMatcher::RegexMatcher(__return_storage_ptr__,&local_40,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

StdString::RegexMatcher Matches(std::string const& regex, CaseSensitive::Choice caseSensitivity) {
        return StdString::RegexMatcher(regex, caseSensitivity);
    }